

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterSystem.h
# Opt level: O3

void __thiscall
KDIS::DATA_TYPE::EmissionSystem::SetEmitterSystemRecord(EmissionSystem *this,EmitterSystem *ESR)

{
  KUINT8 KVar1;
  KUINT8 KVar2;
  
  KVar1 = ESR->m_ui8Function;
  KVar2 = ESR->m_ui8EmitterIDNumber;
  (this->m_EmitterSystemRecord).m_ui16EmitterName = ESR->m_ui16EmitterName;
  (this->m_EmitterSystemRecord).m_ui8Function = KVar1;
  (this->m_EmitterSystemRecord).m_ui8EmitterIDNumber = KVar2;
  return;
}

Assistant:

class KDIS_EXPORT EmitterSystem : public DataTypeBase
{
protected:

    KUINT16 m_ui16EmitterName;

    KUINT8 m_ui8Function;

    KUINT8 m_ui8EmitterIDNumber;

public:

    static const KUINT16 EMITTER_SYSTEM_SIZE = 4;

    EmitterSystem();

    explicit EmitterSystem(KDataStream &stream) noexcept(false);

    explicit EmitterSystem(EmitterName EN, EmitterFunction F, KUINT8 ID);

    ~EmitterSystem() override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::SetEmitterName
    //              KDIS::DATA_TYPE::EmitterSystem::GetEmitterName
    // Description: Emitter name
    // Parameter:   EmitterName EN, void
    //************************************
    void SetEmitterName( EmitterName EN );
    EmitterName GetEmitterName() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::SetFunction
    //              KDIS::DATA_TYPE::EmitterSystem::GetFunction
    // Description: Emitter function
    // Parameter:   EmitterFunction F, void
    //************************************
    void SetFunction( EmitterFunction F );
    EmitterFunction GetFunction() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::SetEmitterID
    //              KDIS::DATA_TYPE::EmitterSystem::GetEmitterID
    // Description: ID of the emitter
    // Parameter:   KUINT8 ID, void
    //************************************
    void SetEmitterID( KUINT8 ID );
    KUINT8 GetEmitterID() const;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::GetAsString
    // Description: Returns a string representation
    //************************************
    KString GetAsString() const override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::Decode
    // Description: Convert From Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    void Decode(KDataStream &stream) noexcept(false) override;

    //************************************
    // FullName:    KDIS::DATA_TYPE::EmitterSystem::Encode
    // Description: Convert To Network Data.
    // Parameter:   KDataStream & stream
    //************************************
    KDataStream Encode() const override;

    void Encode(KDataStream &stream) const override;

    KBOOL operator == ( const EmitterSystem & Value ) const;
    KBOOL operator != ( const EmitterSystem & Value ) const;
}